

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O1

bool __thiscall
Lib::
FilteredIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/Induction.cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/Induction.cpp:750:15),_false>
::hasNext(FilteredIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:750:15),_false>
          *this)

{
  Option<Lib::VirtualIterator<Inferences::InductionContext>_> *this_00;
  long *plVar1;
  pointer ppTVar2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_01;
  unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
  *this_02;
  int iVar5;
  char cVar6;
  bool bVar7;
  char cVar8;
  byte bVar9;
  __node_base _Var10;
  uint uVar11;
  Value VVar12;
  Value local_150;
  undefined1 local_148 [96];
  OptionBase<Inferences::InductionContext> *local_e8;
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>_>
  *local_e0;
  InductionContext local_d8;
  pointer local_88;
  Value VStack_80;
  pointer local_78;
  _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_70;
  
  if ((this->_next).super_OptionBase<Inferences::InductionContext>._isSome == false) {
    local_e8 = &(this->_next).super_OptionBase<Inferences::InductionContext>;
    local_e0 = &this->_inn;
    this_00 = &(this->_inn)._current;
    do {
      VVar12 = (Value)local_148;
      cVar6 = (this_00->super_OptionBase<Lib::VirtualIterator<Inferences::InductionContext>_>).
              _isSome;
      if ((bool)cVar6 == true) {
        cVar6 = (**(code **)(*(long *)(this->_inn)._current.
                                      super_OptionBase<Lib::VirtualIterator<Inferences::InductionContext>_>
                                      ._elem._elem + 0x10))();
        if (cVar6 == '\0') {
          do {
            bVar7 = FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>
                    ::hasNext(&(this->_inn)._master._inner);
            if (bVar7) {
              MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/Induction.cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>
              ::next((MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>
                      *)&local_150.init);
              VVar12 = local_150;
              if (local_150 == (Value)0x0) {
                local_148[0] = 1;
                local_148._8_8_ = local_150;
              }
              else {
                iVar5 = *(int *)((long)local_150 + 8);
                *(int *)((long)local_150 + 8) = iVar5 + 1;
                local_148[0] = 1;
                *(int *)((long)local_150 + 8) = iVar5 + 2;
                local_148._8_8_ = local_150;
                *(int *)((long)local_150 + 8) = iVar5 + 3;
                plVar1 = (long *)((long)local_150 + 8);
                *(int *)plVar1 = *(int *)plVar1 + -1;
                if (*(int *)plVar1 == 0) {
                  (**(code **)(*(long *)local_150 + 8))(local_150);
                }
              }
            }
            else {
              local_148._0_8_ = (pointer)0x0;
              local_148._8_8_ = (Value)0x0;
            }
            OptionBase<Lib::VirtualIterator<Inferences::InductionContext>_>::operator=
                      (&this_00->
                        super_OptionBase<Lib::VirtualIterator<Inferences::InductionContext>_>,
                       (OptionBase<Lib::VirtualIterator<Inferences::InductionContext>_> *)local_148)
            ;
            if (((bool)local_148[0] == true) && ((Value)local_148._8_8_ != (Value)0x0)) {
              ppTVar2 = (pointer)(local_148._8_8_ + 8);
              *(int *)ppTVar2 = *(int *)ppTVar2 + -1;
              if (*(int *)ppTVar2 == 0) {
                (**(code **)&(*(Term **)local_148._8_8_)->_functor)();
              }
            }
            if (bVar7) {
              if (VVar12 != (Value)0x0) {
                plVar1 = (long *)((long)VVar12 + 8);
                *(int *)plVar1 = *(int *)plVar1 + -1;
                if (*(int *)plVar1 == 0) {
                  (**(code **)(*(long *)VVar12 + 8))(VVar12);
                }
              }
              if (local_150 != (Value)0x0) {
                plVar1 = (long *)((long)local_150 + 8);
                *(int *)plVar1 = *(int *)plVar1 + -1;
                if (*(int *)plVar1 == 0) {
                  (**(code **)(*(long *)local_150 + 8))();
                }
              }
            }
            cVar6 = (this_00->super_OptionBase<Lib::VirtualIterator<Inferences::InductionContext>_>)
                    ._isSome;
          } while (((bool)cVar6 != false) &&
                  (cVar8 = (**(code **)(*(long *)(this->_inn)._current.
                                                 super_OptionBase<Lib::VirtualIterator<Inferences::InductionContext>_>
                                                 ._elem._elem + 0x10))(), cVar8 == '\0'));
          goto LAB_004f1e5d;
        }
      }
      else {
LAB_004f1e5d:
        if (cVar6 == '\0') {
          return false;
        }
      }
      (**(code **)(*(long *)(this->_inn)._current.
                            super_OptionBase<Lib::VirtualIterator<Inferences::InductionContext>_>.
                            _elem._elem + 0x18))(local_148);
      local_d8._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)local_148._0_8_;
      local_d8._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)local_148._8_8_;
      local_d8._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)local_148._16_8_;
      local_148._0_8_ = (pointer)0x0;
      local_148._8_8_ = (Value)0x0;
      local_148._16_8_ = (pointer)0x0;
      this_02 = &local_d8._cls;
      this_01 = (_Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_148 + 0x18);
      std::
      _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable(&this_02->_M_h,this_01,this_01);
      std::
      _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(this_01);
      if ((pointer)local_148._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_148._0_8_,local_148._16_8_ - local_148._0_8_);
      }
      local_88 = local_d8._indTerms.
                 super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      VStack_80 = (Value)local_d8._indTerms.
                         super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl
                         .super__Vector_impl_data._M_finish;
      local_78 = local_d8._indTerms.
                 super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      local_d8._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable(&local_70,this_02,this_02);
      std::
      _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&this_02->_M_h);
      if (local_d8._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8._indTerms.
                        super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_d8._indTerms.
                              super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8._indTerms.
                              super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      uVar11 = 0;
      if (local_70._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
        bVar9 = 0;
        _Var10._M_nxt = local_70._M_before_begin._M_nxt;
        do {
          if ((Clause *)_Var10._M_nxt[1]._M_nxt == *(this->_func).premise) {
            bVar9 = 1;
          }
          p_Var3 = _Var10._M_nxt + 4;
          p_Var4 = _Var10._M_nxt + 3;
          _Var10._M_nxt = (_Var10._M_nxt)->_M_nxt;
          uVar11 = uVar11 + (int)((ulong)((long)p_Var3->_M_nxt - (long)p_Var4->_M_nxt) >> 3);
        } while (_Var10._M_nxt != (_Hash_node_base *)0x0);
        uVar11 = (uint)(bVar9 & 1 < uVar11);
      }
      if ((char)uVar11 != '\0') {
        local_d8._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
        _M_impl.super__Vector_impl_data._M_start = local_88;
        local_d8._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)VStack_80;
        local_d8._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = local_78;
        local_88 = (pointer)0x0;
        VStack_80 = (Value)0x0;
        local_78 = (pointer)0x0;
        std::
        _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_Hashtable(&local_d8._cls._M_h,&local_70);
        OptionBase<Inferences::InductionContext>::OptionBase
                  ((OptionBase<Inferences::InductionContext> *)local_148,&local_d8);
        OptionBase<Inferences::InductionContext>::operator=
                  (local_e8,(OptionBase<Inferences::InductionContext> *)local_148);
        OptionBase<Inferences::InductionContext>::~OptionBase
                  ((OptionBase<Inferences::InductionContext> *)local_148);
        std::
        _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&local_d8._cls._M_h);
        if (local_d8._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8._indTerms.
                          super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_d8._indTerms.
                                super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8._indTerms.
                                super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      std::
      _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_70);
      if (local_88 != (pointer)0x0) {
        operator_delete(local_88,(long)local_78 - (long)local_88);
      }
    } while ((char)uVar11 == '\0');
  }
  return true;
}

Assistant:

bool hasNext()
  {
    if(_next.isSome()) {
      return true;
    }
    while(_inn.hasNext()) {
      OWN_ELEMENT_TYPE next = move_if_value<OWN_ELEMENT_TYPE>(_inn.next());
      if(_func(next)) {
        _next = Option<OWN_ELEMENT_TYPE>(move_if_value<OWN_ELEMENT_TYPE>(next));
        return true;
      } else {
        __doDeletion<deleteFilteredOut>{}(_inn);
      }
    }
    return false;
  }